

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

FloatFormat * tcu::FloatFormat::nativeDouble(void)

{
  FloatFormat *in_RDI;
  
  nativeFormat<double>();
  return in_RDI;
}

Assistant:

FloatFormat	FloatFormat::nativeDouble (void)
{
	return nativeFormat<double>();
}